

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O2

void __thiscall randomx::Instruction::h_IADD_M(Instruction *this,ostream *os)

{
  ostream *poVar1;
  uint uVar2;
  uint srcIndex;
  
  uVar2 = this->dst & 7;
  srcIndex = this->src & 7;
  if ((char)uVar2 == (char)srcIndex) {
    poVar1 = std::operator<<(os,"r");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,uVar2);
    std::operator<<(poVar1,", ");
    genAddressImm(this,os);
  }
  else {
    poVar1 = std::operator<<(os,"r");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,uVar2);
    std::operator<<(poVar1,", ");
    genAddressReg(this,os,srcIndex);
  }
  std::endl<char,std::char_traits<char>>(os);
  return;
}

Assistant:

void Instruction::h_IADD_M(std::ostream& os) const {
		auto dstIndex = dst % RegistersCount;
		auto srcIndex = src % RegistersCount;
		if (dstIndex != srcIndex) {
			os << "r" << dstIndex << ", ";
			genAddressReg(os, srcIndex);
			os << std::endl;
		}
		else {
			os << "r" << dstIndex << ", ";
			genAddressImm(os);
			os << std::endl;
		}
	}